

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void minmaxStep(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  Mem *pMem2;
  void *pvVar1;
  bool bVar2;
  int iVar3;
  Mem *pMem1;
  
  pMem2 = *argv;
  pMem1 = (Mem *)sqlite3_aggregate_context(context,0x38);
  if (pMem1 != (Mem *)0x0) {
    if ((*argv)->type == '\x05') {
      if (pMem1->flags == 0) {
        return;
      }
    }
    else {
      if (pMem1->flags == 0) {
LAB_00174b32:
        sqlite3VdbeMemCopy(pMem1,pMem2);
        return;
      }
      pvVar1 = context->pFunc->pUserData;
      iVar3 = sqlite3MemCompare(pMem1,pMem2,context->pColl);
      bVar2 = -1 < iVar3;
      if (pvVar1 == (void *)0x0) {
        bVar2 = iVar3 < 1;
      }
      if (!bVar2) goto LAB_00174b32;
    }
    context->skipFlag = 1;
  }
  return;
}

Assistant:

static void minmaxStep(
  sqlite3_context *context, 
  int NotUsed, 
  sqlite3_value **argv
){
  Mem *pArg  = (Mem *)argv[0];
  Mem *pBest;
  UNUSED_PARAMETER(NotUsed);

  pBest = (Mem *)sqlite3_aggregate_context(context, sizeof(*pBest));
  if( !pBest ) return;

  if( sqlite3_value_type(argv[0])==SQLITE_NULL ){
    if( pBest->flags ) sqlite3SkipAccumulatorLoad(context);
  }else if( pBest->flags ){
    int max;
    int cmp;
    CollSeq *pColl = sqlite3GetFuncCollSeq(context);
    /* This step function is used for both the min() and max() aggregates,
    ** the only difference between the two being that the sense of the
    ** comparison is inverted. For the max() aggregate, the
    ** sqlite3_user_data() function returns (void *)-1. For min() it
    ** returns (void *)db, where db is the sqlite3* database pointer.
    ** Therefore the next statement sets variable 'max' to 1 for the max()
    ** aggregate, or 0 for min().
    */
    max = sqlite3_user_data(context)!=0;
    cmp = sqlite3MemCompare(pBest, pArg, pColl);
    if( (max && cmp<0) || (!max && cmp>0) ){
      sqlite3VdbeMemCopy(pBest, pArg);
    }else{
      sqlite3SkipAccumulatorLoad(context);
    }
  }else{
    sqlite3VdbeMemCopy(pBest, pArg);
  }
}